

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigNumber.cpp
# Opt level: O2

BigNumber * operator/(BigNumber *__return_storage_ptr__,BigNumber *nb1,BigNumber *nb2)

{
  pointer puVar1;
  unsigned_long uVar2;
  bool bVar3;
  uint length;
  int iVar4;
  int iVar5;
  ulong uVar6;
  int local_184;
  BigNumber val;
  BigNumber local_150;
  BigNumber local_130;
  BigNumber local_110;
  BigNumber local_f0;
  BigNumber local_d0;
  BigNumber local_b0;
  BigNumber local_90;
  BigNumber local_70;
  BigNumber local_50;
  
  uVar2 = nb1->m_base;
  Polynome::Polynome(&__return_storage_ptr__->super_Polynome);
  __return_storage_ptr__->m_base = uVar2;
  length = (uint)((ulong)((long)(nb2->super_Polynome).m_coef.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)(nb2->super_Polynome).m_coef.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start) >> 2);
  BigNumber::m_slice(&val,nb1,(int)((ulong)((long)(nb1->super_Polynome).m_coef.
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                           (long)(nb1->super_Polynome).m_coef.
                                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                 ._M_impl.super__Vector_impl_data._M_start) >> 2) -
                              length,length);
  bVar3 = operator>(nb2,&val);
  if (bVar3) {
    BigNumber::operator>>(&val,1);
    BigNumber::BigNumber(&local_d0,&val);
    BigNumber::m_slice(&local_f0,nb1,
                       ~(uint)((ulong)((long)(nb2->super_Polynome).m_coef.
                                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)(nb2->super_Polynome).m_coef.
                                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                            ._M_impl.super__Vector_impl_data._M_start) >> 2) +
                       (int)((ulong)((long)(nb1->super_Polynome).m_coef.
                                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(nb1->super_Polynome).m_coef.
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          ._M_impl.super__Vector_impl_data._M_start) >> 2),1);
    operator+(&local_b0,&local_d0,&local_f0);
    BigNumber::operator=(&val,&local_b0);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_b0);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_f0);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_d0);
  }
  iVar4 = (int)((ulong)((long)(nb1->super_Polynome).m_coef.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)(nb1->super_Polynome).m_coef.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start) >> 2) -
          (int)((ulong)((long)val.super_Polynome.m_coef.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)val.super_Polynome.m_coef.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start) >> 2);
  iVar5 = iVar4;
  while (bVar3 = iVar5 != 0, iVar5 = iVar5 + -1, bVar3) {
    local_184 = 0;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<int>
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)__return_storage_ptr__,
               &local_184);
  }
  for (uVar6 = 0; uVar6 != iVar4 + 1; uVar6 = uVar6 + 1) {
    while( true ) {
      bVar3 = operator>=(&val,nb2);
      if (!bVar3) break;
      puVar1 = (__return_storage_ptr__->super_Polynome).m_coef.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start + (iVar4 - (uint)uVar6);
      *puVar1 = *puVar1 + 1;
      BigNumber::BigNumber(&local_70,&val);
      BigNumber::BigNumber(&local_90,nb2);
      operator-(&local_50,&local_70,&local_90);
      BigNumber::operator=(&val,&local_50);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_50);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_90);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_70);
    }
    BigNumber::operator>>(&val,1);
    BigNumber::BigNumber(&local_130,&val);
    BigNumber::m_slice(&local_150,nb1,~(uint)uVar6 + iVar4,1);
    operator+(&local_110,&local_130,&local_150);
    BigNumber::operator=(&val,&local_110);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_110);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_150);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_130);
  }
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&val);
  return __return_storage_ptr__;
}

Assistant:

BigNumber operator / (BigNumber nb1, BigNumber nb2) {
//    clock_t t1, t2;
//    static clock_t t_tmp;
//    static unsigned int cmp = 0;
//    t1 = clock();

    BigNumber quotient(nb1.m_base);
    BigNumber val = nb1.m_slice(nb1.m_degre() - nb2.m_degre(), nb2.m_degre());

    if(nb2 > val){
        val >> 1;
        val = val + nb1.m_slice(nb1.m_degre() - nb2.m_degre() - 1, 1);
    }

    unsigned int quotient_size = nb1.m_degre() - val.m_degre();

    for(unsigned int i = 0; i < quotient_size; i++){
        quotient.m_coef.emplace_back(0);
    }

    for(unsigned int i = 0; i < quotient_size + 1; i++){
        while(val >= nb2){
            quotient.m_coef[quotient_size - i] += 1;
            val = val - nb2;
        }
        val >> 1;
        val = val + nb1.m_slice(quotient_size - i - 1, 1);
    }
//    t2 = clock();
//    t_tmp += (t2 - t1);
//    cmp += 1;
//    cout << " Division : " << (t2 - t1)/(float)cmp << endl;
    return quotient;
}